

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestJsonName_Test::
~DescriptorPoolTypeResolverTest_TestJsonName_Test
          (DescriptorPoolTypeResolverTest_TestJsonName_Test *this)

{
  TypeResolver *pTVar1;
  
  (this->super_DescriptorPoolTypeResolverTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorPoolTypeResolverTest_019551d0;
  pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  if (pTVar1 != (TypeResolver *)0x0) {
    (*pTVar1->_vptr_TypeResolver[1])();
  }
  (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
  super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
  .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl =
       (TypeResolver *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestJsonName) {
  Type type;
  ASSERT_TRUE(resolver_
                  ->ResolveMessageType(
                      GetTypeUrl<proto2_unittest::TestAllTypes>(), &type)
                  .ok());
  EXPECT_EQ("optionalInt32", FindField(type, "optional_int32")->json_name());

  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(GetTypeUrl<proto3::TestCustomJsonName>(), &type)
          .ok());
  EXPECT_EQ("@value", FindField(type, "value")->json_name());
}